

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O2

expr_node * __thiscall expr_tree::cotDeriv(expr_tree *this,expr_node *node)

{
  expr_node *_right;
  expr_node *this_00;
  expr_value eStack_18;
  
  _right = tanDeriv(this,node);
  (_right->right->left->value).integer = 9;
  this_00 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&eStack_18,2);
  expr_node::expr_node(this_00,'\x05',&eStack_18);
  this_00->right = _right;
  Link(this_00,(expr_node *)0x0,_right);
  return this_00;
}

Assistant:

expr_node* expr_tree::cotDeriv(const expr_node* node)
{
    auto frac = tanDeriv(node);
    frac->right->left->value.integer = SIN;
    auto deriv = new expr_node(OP, (long)SUB);
    deriv->right = frac;
    Link(deriv, nullptr, deriv->right);
    return deriv;
}